

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

bcf_hdr_t * bcf_hdr_subset(bcf_hdr_t *h0,int n,char **samples,int *imap)

{
  int iVar1;
  void *_hash;
  bcf_hdr_t *hdr;
  char *version;
  bool bVar2;
  int local_7c;
  int end;
  int i;
  char *p;
  int j;
  bcf_hdr_t *h;
  kstring_t str;
  char *htxt;
  void *names_hash;
  int *piStack_30;
  int hlen;
  int *imap_local;
  char **samples_local;
  bcf_hdr_t *pbStack_18;
  int n_local;
  bcf_hdr_t *h0_local;
  
  piStack_30 = imap;
  imap_local = (int *)samples;
  samples_local._4_4_ = n;
  pbStack_18 = h0;
  _hash = khash_str2int_init();
  str.s = bcf_hdr_fmt_text(pbStack_18,1,(int *)((long)&names_hash + 4));
  str.l = 0;
  h = (bcf_hdr_t *)0x0;
  str.m = 0;
  hdr = bcf_hdr_init("w");
  version = bcf_hdr_get_version(pbStack_18);
  bcf_hdr_set_version(hdr,version);
  for (p._4_4_ = 0; p._4_4_ < samples_local._4_4_; p._4_4_ = p._4_4_ + 1) {
    piStack_30[p._4_4_] = -1;
  }
  if (pbStack_18->n[2] < 1) {
    kputsn(str.s,names_hash._4_4_,(kstring_t *)&h);
  }
  else {
    local_7c = 0;
    iVar1 = 7;
    if (samples_local._4_4_ != 0) {
      iVar1 = 8;
    }
    do {
      _end = strstr(str.s,"#CHROM\t");
      if (_end == (char *)0x0) break;
    } while ((_end <= str.s) || (_end[-1] != '\n'));
    for (; _end = strchr(_end,9), _end != (char *)0x0 && local_7c < iVar1; local_7c = local_7c + 1)
    {
      _end = _end + 1;
    }
    if (local_7c != iVar1) {
      free(hdr);
      free((void *)str.m);
      return (bcf_hdr_t *)0x0;
    }
    kputsn(str.s,(int)_end - (int)str.s,(kstring_t *)&h);
    for (local_7c = 0; local_7c < samples_local._4_4_; local_7c = local_7c + 1) {
      iVar1 = khash_str2int_has_key(_hash,*(char **)(imap_local + (long)local_7c * 2));
      if (iVar1 != 0) {
        fprintf(_stderr,"[E::bcf_hdr_subset] Duplicate sample name \"%s\".\n",
                *(undefined8 *)(imap_local + (long)local_7c * 2));
        free((void *)str.m);
        free(str.s);
        khash_str2int_destroy(_hash);
        bcf_hdr_destroy(hdr);
        return (bcf_hdr_t *)0x0;
      }
      iVar1 = bcf_hdr_id2int(pbStack_18,2,*(char **)(imap_local + (long)local_7c * 2));
      piStack_30[local_7c] = iVar1;
      if (-1 < piStack_30[local_7c]) {
        kputc(9,(kstring_t *)&h);
        kputs(*(char **)(imap_local + (long)local_7c * 2),(kstring_t *)&h);
        khash_str2int_inc(_hash,*(char **)(imap_local + (long)local_7c * 2));
      }
    }
  }
  while( true ) {
    bVar2 = false;
    if ((h != (bcf_hdr_t *)0x0) && (bVar2 = true, *(char *)((long)h->n + (str.m - 1)) != '\0')) {
      bVar2 = *(char *)((long)h->n + (str.m - 1)) == '\n';
    }
    if (!bVar2) break;
    h = (bcf_hdr_t *)((long)&h[-1].mem.s + 7);
  }
  kputc(10,(kstring_t *)&h);
  bcf_hdr_parse(hdr,(char *)str.m);
  free((void *)str.m);
  free(str.s);
  khash_str2int_destroy(_hash);
  return hdr;
}

Assistant:

bcf_hdr_t *bcf_hdr_subset(const bcf_hdr_t *h0, int n, char *const* samples, int *imap)
{
    int hlen;
    void *names_hash = khash_str2int_init();
    char *htxt = bcf_hdr_fmt_text(h0, 1, &hlen);
    kstring_t str;
    bcf_hdr_t *h;
    str.l = str.m = 0; str.s = 0;
    h = bcf_hdr_init("w");
    bcf_hdr_set_version(h,bcf_hdr_get_version(h0));
    int j;
    for (j=0; j<n; j++) imap[j] = -1;
    if ( bcf_hdr_nsamples(h0) > 0) {
        char *p;
        int i = 0, end = n? 8 : 7;
        while ((p = strstr(htxt, "#CHROM\t")) != 0)
            if (p > htxt && *(p-1) == '\n') break;
        while ((p = strchr(p, '\t')) != 0 && i < end) ++i, ++p;
        if (i != end) {
            free(h); free(str.s);
            return 0; // malformated header
        }
        kputsn(htxt, p - htxt, &str);
        for (i = 0; i < n; ++i) {
            if ( khash_str2int_has_key(names_hash,samples[i]) )
            {
                fprintf(stderr,"[E::bcf_hdr_subset] Duplicate sample name \"%s\".\n", samples[i]);
                free(str.s);
                free(htxt);
                khash_str2int_destroy(names_hash);
                bcf_hdr_destroy(h);
                return NULL;
            }
            imap[i] = bcf_hdr_id2int(h0, BCF_DT_SAMPLE, samples[i]);
            if (imap[i] < 0) continue;
            kputc('\t', &str);
            kputs(samples[i], &str);
            khash_str2int_inc(names_hash,samples[i]);
        }
    } else kputsn(htxt, hlen, &str);
    while (str.l && (!str.s[str.l-1] || str.s[str.l-1]=='\n') ) str.l--; // kill trailing zeros and newlines
    kputc('\n',&str);
    bcf_hdr_parse(h, str.s);
    free(str.s);
    free(htxt);
    khash_str2int_destroy(names_hash);
    return h;
}